

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86_avx.cpp
# Opt level: O0

void ncnn::rmsnorm(float *ptr,float *gamma_ptr,float eps,int elemcount,int elempack)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int in_ECX;
  int in_EDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float in_XMM0_Da;
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  __m128 _p_14;
  __m256 _p_13;
  __m512 _p_12;
  int i_2;
  __m128 _gamma_8;
  __m128 _p_11;
  __m256 _gamma_7;
  __m256 _p_10;
  __m512 _gamma_6;
  __m512 _p_9;
  __m128 _gamma_5;
  __m128 _p_8;
  __m256 _gamma_4;
  __m128 _gamma1_2;
  __m128 _gamma0_2;
  __m256 _p_7;
  __m512 _gamma_3;
  __m256 _gamma23;
  __m256 _gamma01;
  __m128 _gamma3;
  __m128 _gamma2;
  __m128 _gamma1_1;
  __m128 _gamma0_1;
  __m512 _p_6;
  __m256 _gamma_2;
  __m256 _p_5;
  __m512 _gamma_1;
  __m256 _gamma1;
  __m256 _gamma0;
  __m512 _p_4;
  __m512 _gamma;
  __m512 _p_3;
  int i_1;
  __m128 _eps_2;
  __m128 _elemcount_2;
  __m128 _rms1_3;
  __m128 _rms0_3;
  __m256 _rms1_2;
  __m256 _rms0_2;
  __m256 _eps_1;
  __m256 _elemcount_1;
  __m256 _rms1_1;
  __m256 _rms0_1;
  __m256 _rms1;
  __m256 _rms0;
  __m512 _eps;
  __m512 _elemcount;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr0;
  float rms;
  __m128 _rms;
  __m256 _rms_avx;
  __m512 _rms_avx512;
  int size;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x128_1;
  __m128 x32_2;
  __m128 x64_2;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  int local_2324;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2230;
  undefined8 uStack_2228;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  int local_1f04;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  int local_1c84;
  undefined1 (*local_1c80) [64];
  float local_1c74;
  undefined1 local_1c70 [8];
  undefined8 uStack_1c68;
  undefined1 local_1c60 [8];
  undefined8 uStack_1c58;
  undefined1 auStack_1c50 [8];
  undefined8 uStack_1c48;
  undefined1 local_1c40 [64];
  undefined1 (*local_1bd0) [64];
  undefined1 (*local_1bc8) [64];
  undefined1 local_1580 [32];
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float local_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  float local_f50;
  float fStack_f4c;
  float local_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  float local_e90;
  float fStack_e8c;
  float local_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float local_e20;
  float fStack_e1c;
  float local_e10;
  float fStack_e0c;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined4 uStack_664;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined4 uStack_564;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_250;
  undefined8 uStack_248;
  
  iVar18 = in_EDX * in_ECX;
  local_1c40 = vbroadcastss_avx512f(ZEXT416(0));
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  _local_1c60 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  uStack_350 = auVar5._0_8_;
  uStack_348 = auVar5._8_8_;
  auStack_1c50 = (undefined1  [8])uStack_350;
  uStack_1c48 = uStack_348;
  _local_1c70 = ZEXT816(0);
  local_1c74 = 0.0;
  local_1c80 = in_RDI;
  for (local_1c84 = 0; local_1c84 + 0xf < iVar18; local_1c84 = local_1c84 + 0x10) {
    local_1c40 = vfmadd213ps_avx512f(*local_1c80,*local_1c80,local_1c40);
    local_1c80 = local_1c80 + 1;
  }
  for (; local_1c84 + 7 < iVar18; local_1c84 = local_1c84 + 8) {
    auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])*local_1c80,*(undefined1 (*) [32])*local_1c80,
                             _local_1c60);
    _local_1c60 = ZEXT1632(auVar5);
    local_1c80 = (undefined1 (*) [64])(*local_1c80 + 0x20);
  }
  for (; local_1c84 + 3 < iVar18; local_1c84 = local_1c84 + 4) {
    _local_1c70 = vfmadd213ps_fma(*(undefined1 (*) [16])*local_1c80,
                                  *(undefined1 (*) [16])*local_1c80,_local_1c70);
    local_1c80 = (undefined1 (*) [64])(*local_1c80 + 0x10);
  }
  for (; local_1c84 < iVar18; local_1c84 = local_1c84 + 1) {
    local_1c74 = *(float *)*local_1c80 * *(float *)*local_1c80 + local_1c74;
    local_1c80 = (undefined1 (*) [64])(*local_1c80 + 4);
  }
  if (in_ECX == 0x10) {
    auVar20 = vbroadcastss_avx512f(ZEXT416((uint)(float)in_EDX));
    auVar21 = vbroadcastss_avx512f(ZEXT416((uint)in_XMM0_Da));
    auVar20 = vdivps_avx512f(local_1c40,auVar20);
    auVar20 = vaddps_avx512f(auVar20,auVar21);
    auVar19 = vrsqrtps_avx(auVar20._0_32_);
    vextractf64x4_avx512f(auVar20,1);
    auVar8 = vrsqrtps_avx(local_1580);
    local_1c40 = vinsertf64x4_avx512f(ZEXT3264(auVar19),auVar8,1);
  }
  if (in_ECX == 8) {
    local_1200 = local_1c60._0_4_;
    fStack_11fc = local_1c60._4_4_;
    fStack_11f8 = local_1c60._8_4_;
    fStack_11f4 = local_1c60._12_4_;
    fStack_11f0 = local_1c60._16_4_;
    fStack_11ec = local_1c60._20_4_;
    fStack_11e8 = local_1c60._24_4_;
    fStack_11e4 = local_1c60._28_4_;
    local_1220 = local_1c40._0_4_;
    fStack_121c = local_1c40._4_4_;
    fStack_1218 = local_1c40._8_4_;
    fStack_1214 = local_1c40._12_4_;
    fStack_1210 = local_1c40._16_4_;
    fStack_120c = local_1c40._20_4_;
    fStack_1208 = local_1c40._24_4_;
    fStack_1204 = local_1c40._28_4_;
    local_1260 = local_1c40._32_4_;
    fStack_125c = local_1c40._36_4_;
    fStack_1258 = local_1c40._40_4_;
    fStack_1254 = local_1c40._44_4_;
    fStack_1250 = local_1c40._48_4_;
    fStack_124c = local_1c40._52_4_;
    fStack_1248 = local_1c40._56_4_;
    fStack_1244 = local_1c40._60_4_;
    local_1c60._4_4_ = fStack_11fc + fStack_121c + fStack_125c;
    local_1c60._0_4_ = local_1200 + local_1220 + local_1260;
    uStack_1c58._0_4_ = fStack_11f8 + fStack_1218 + fStack_1258;
    uStack_1c58._4_4_ = fStack_11f4 + fStack_1214 + fStack_1254;
    auStack_1c50._0_4_ = fStack_11f0 + fStack_1210 + fStack_1250;
    auStack_1c50._4_4_ = fStack_11ec + fStack_120c + fStack_124c;
    uStack_1c48._0_4_ = fStack_11e8 + fStack_1208 + fStack_1248;
    uStack_1c48._4_4_ = fStack_11e4 + fStack_1204 + fStack_1244;
    auVar19 = _local_1c60;
    fVar22 = (float)in_EDX;
    auVar5 = vinsertps_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar22),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar22),0x30);
    auVar6 = vinsertps_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar22),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar22),0x30);
    uStack_310 = auVar6._0_8_;
    uStack_308 = auVar6._8_8_;
    auVar6 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)in_XMM0_Da),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)in_XMM0_Da),0x30);
    auVar7 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)in_XMM0_Da),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)in_XMM0_Da),0x30);
    uStack_1c48 = auVar19._24_8_;
    auVar11._16_8_ = auStack_1c50;
    auVar11._0_16_ = _local_1c60;
    auVar11._24_8_ = uStack_1c48;
    auVar8._16_8_ = uStack_310;
    auVar8._0_16_ = auVar5;
    auVar8._24_8_ = uStack_308;
    auVar19 = vdivps_avx(auVar11,auVar8);
    local_1280 = auVar19._0_4_;
    fStack_127c = auVar19._4_4_;
    fStack_1278 = auVar19._8_4_;
    fStack_1274 = auVar19._12_4_;
    fStack_1270 = auVar19._16_4_;
    fStack_126c = auVar19._20_4_;
    fStack_1268 = auVar19._24_4_;
    fStack_1264 = auVar19._28_4_;
    local_12a0 = auVar6._0_4_;
    fStack_129c = auVar6._4_4_;
    fStack_1298 = auVar6._8_4_;
    fStack_1294 = auVar6._12_4_;
    fStack_1290 = auVar7._0_4_;
    fStack_128c = auVar7._4_4_;
    fStack_1288 = auVar7._8_4_;
    fStack_1284 = auVar7._12_4_;
    local_1c60._4_4_ = fStack_127c + fStack_129c;
    local_1c60._0_4_ = local_1280 + local_12a0;
    uStack_1c58._0_4_ = fStack_1278 + fStack_1298;
    uStack_1c58._4_4_ = fStack_1274 + fStack_1294;
    auStack_1c50._0_4_ = fStack_1270 + fStack_1290;
    auStack_1c50._4_4_ = fStack_126c + fStack_128c;
    uStack_1c48._0_4_ = fStack_1268 + fStack_1288;
    uStack_1c48._4_4_ = fStack_1264 + fStack_1284;
    auVar19 = _local_1c60;
    uStack_1c48 = auVar19._24_8_;
    auVar19._16_8_ = auStack_1c50;
    auVar19._0_16_ = _local_1c60;
    auVar19._24_8_ = uStack_1c48;
    _local_1c60 = vrsqrtps_avx(auVar19);
    local_1c40 = vinsertf64x4_avx512f(ZEXT3264(_local_1c60),_local_1c60,1);
  }
  if (in_ECX == 4) {
    fStack_12b0 = local_1c60._16_4_;
    fStack_12ac = local_1c60._20_4_;
    fStack_12a8 = local_1c60._24_4_;
    fStack_12a4 = local_1c60._28_4_;
    fStack_12d0 = local_1c40._16_4_;
    fStack_12cc = local_1c40._20_4_;
    fStack_12c8 = local_1c40._24_4_;
    fStack_12c4 = local_1c40._28_4_;
    fStack_1310 = local_1c40._48_4_;
    fStack_130c = local_1c40._52_4_;
    fStack_1308 = local_1c40._56_4_;
    fStack_1304 = local_1c40._60_4_;
    local_1120 = local_1c70._0_4_;
    fStack_111c = local_1c70._4_4_;
    fStack_1118 = local_1c70._8_4_;
    fStack_1114 = local_1c70._12_4_;
    local_1150 = (float)local_1ee0;
    fStack_114c = (float)((ulong)local_1ee0 >> 0x20);
    fStack_1148 = (float)uStack_1ed8;
    fStack_1144 = (float)((ulong)uStack_1ed8 >> 0x20);
    local_1c70._4_4_ = fStack_111c + fStack_12ac + fStack_12cc + fStack_130c + fStack_114c;
    local_1c70._0_4_ = local_1120 + fStack_12b0 + fStack_12d0 + fStack_1310 + local_1150;
    uStack_1c68._0_4_ = fStack_1118 + fStack_12a8 + fStack_12c8 + fStack_1308 + fStack_1148;
    uStack_1c68._4_4_ = fStack_1114 + fStack_12a4 + fStack_12c4 + fStack_1304 + fStack_1144;
    fVar22 = (float)in_EDX;
    auVar5._4_4_ = fVar22;
    auVar5._0_4_ = fVar22;
    auVar5._12_4_ = fVar22;
    auVar5._8_4_ = fVar22;
    auVar6._8_8_ = uStack_1c68;
    auVar6._0_8_ = local_1c70;
    auVar5 = vdivps_avx(auVar6,auVar5);
    local_1160 = auVar5._0_4_;
    fStack_115c = auVar5._4_4_;
    fStack_1158 = auVar5._8_4_;
    fStack_1154 = auVar5._12_4_;
    local_1c70._4_4_ = fStack_115c + in_XMM0_Da;
    local_1c70._0_4_ = local_1160 + in_XMM0_Da;
    uStack_1c68._0_4_ = fStack_1158 + in_XMM0_Da;
    uStack_1c68._4_4_ = fStack_1154 + in_XMM0_Da;
    auVar7._8_8_ = uStack_1c68;
    auVar7._0_8_ = local_1c70;
    _local_1c70 = vrsqrtps_avx(auVar7);
    _auStack_1c50 = _local_1c70;
    _local_1c60 = _local_1c70;
    local_1c40 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_1c68,CONCAT816(local_1c70,_local_1c70))),
                            _local_1c60,1);
  }
  if (in_ECX == 1) {
    auVar19 = vextractf64x4_avx512f(local_1c40,1);
    fStack_f90 = local_1c40._16_4_;
    fStack_f8c = local_1c40._20_4_;
    fStack_f88 = local_1c40._24_4_;
    fStack_f84 = local_1c40._28_4_;
    fStack_fb0 = auVar19._16_4_;
    fStack_fac = auVar19._20_4_;
    fStack_fa8 = auVar19._24_4_;
    fStack_fa4 = auVar19._28_4_;
    fVar22 = fStack_f90 + fStack_fb0 + local_f30;
    fVar24 = fStack_f8c + fStack_fac + fStack_f2c;
    uVar12 = CONCAT44(fVar24,fVar22);
    uVar13 = CONCAT44(fStack_f84 + fStack_fa4 + fStack_f24,fStack_f88 + fStack_fa8 + fStack_f28);
    auVar17._8_8_ = uVar13;
    auVar17._0_8_ = uVar12;
    auVar16._8_8_ = uVar13;
    auVar16._0_8_ = uVar12;
    auVar5 = vunpckhpd_avx(auVar16,auVar17);
    local_f50 = auVar5._0_4_;
    fStack_f4c = auVar5._4_4_;
    local_e60 = local_1c60._16_4_;
    fStack_e5c = local_1c60._20_4_;
    fStack_e58 = local_1c60._24_4_;
    fStack_e54 = local_1c60._28_4_;
    local_e70 = local_1c60._0_4_;
    fStack_e6c = local_1c60._4_4_;
    fStack_e68 = local_1c60._8_4_;
    fStack_e64 = local_1c60._12_4_;
    uVar12 = CONCAT44(fStack_e5c + fStack_e6c,local_e60 + local_e70);
    uVar13 = CONCAT44(fStack_e54 + fStack_e64,fStack_e58 + fStack_e68);
    auVar15._8_8_ = uVar13;
    auVar15._0_8_ = uVar12;
    auVar14._8_8_ = uVar13;
    auVar14._0_8_ = uVar12;
    auVar5 = vunpckhpd_avx(auVar14,auVar15);
    local_e90 = auVar5._0_4_;
    fStack_e8c = auVar5._4_4_;
    auVar5 = vunpckhpd_avx(_local_1c70,_local_1c70);
    local_e10 = local_1c70._0_4_;
    fStack_e0c = local_1c70._4_4_;
    local_e20 = auVar5._0_4_;
    fStack_e1c = auVar5._4_4_;
    auVar23._0_4_ =
         (local_1c74 + fVar22 + local_f50 + fVar24 + fStack_f4c +
          local_e60 + local_e70 + local_e90 + fStack_e5c + fStack_e6c + fStack_e8c +
         local_e10 + local_e20 + fStack_e0c + fStack_e1c) / (float)in_EDX;
    auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar5 = vsqrtss_avx(auVar23,ZEXT416((uint)(auVar23._0_4_ + in_XMM0_Da)));
    local_1c74 = 1.0 / auVar5._0_4_;
    local_1c70 = (undefined1  [8])CONCAT44(local_1c74,local_1c74);
    uStack_1c68 = CONCAT44(local_1c74,local_1c74);
    auStack_1c50 = local_1c70;
    uStack_1c48 = uStack_1c68;
    uStack_1c58 = uStack_1c68;
    local_1c60 = local_1c70;
    local_1c40 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_1c68,
                                               CONCAT816(local_1c70,CONCAT88(uStack_1c68,local_1c70)
                                                        ))),_local_1c60,1);
  }
  local_6a0 = local_1c60._0_4_;
  fStack_69c = local_1c60._4_4_;
  fStack_698 = local_1c60._8_4_;
  fStack_694 = local_1c60._12_4_;
  fStack_690 = local_1c60._16_4_;
  fStack_68c = local_1c60._20_4_;
  fStack_688 = local_1c60._24_4_;
  local_460 = local_1c70._0_4_;
  fStack_45c = local_1c70._4_4_;
  fStack_458 = local_1c70._8_4_;
  fStack_454 = local_1c70._12_4_;
  local_1bc8 = in_RDI;
  if (in_RSI == (undefined1 (*) [64])0x0) {
    for (local_2324 = 0; local_2324 + 0xf < iVar18; local_2324 = local_2324 + 0x10) {
      auVar20 = vmulps_avx512f(*local_1bc8,local_1c40);
      local_2380 = auVar20._0_8_;
      uStack_2378 = auVar20._8_8_;
      uStack_2370 = auVar20._16_8_;
      uStack_2368 = auVar20._24_8_;
      uStack_2360 = auVar20._32_8_;
      uStack_2358 = auVar20._40_8_;
      uStack_2350 = auVar20._48_8_;
      uStack_2348 = auVar20._56_8_;
      *(undefined8 *)*local_1bc8 = local_2380;
      *(undefined8 *)(*local_1bc8 + 8) = uStack_2378;
      *(undefined8 *)(*local_1bc8 + 0x10) = uStack_2370;
      *(undefined8 *)(*local_1bc8 + 0x18) = uStack_2368;
      *(undefined8 *)(*local_1bc8 + 0x20) = uStack_2360;
      *(undefined8 *)(*local_1bc8 + 0x28) = uStack_2358;
      *(undefined8 *)(*local_1bc8 + 0x30) = uStack_2350;
      *(undefined8 *)(*local_1bc8 + 0x38) = uStack_2348;
      local_1bc8 = local_1bc8 + 1;
    }
    for (; local_2324 + 7 < iVar18; local_2324 = local_2324 + 8) {
      local_700 = (float)*(undefined8 *)*local_1bc8;
      fStack_6fc = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
      fStack_6f8 = (float)*(undefined8 *)(*local_1bc8 + 8);
      fStack_6f4 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
      fStack_6f0 = (float)*(undefined8 *)(*local_1bc8 + 0x10);
      fStack_6ec = (float)((ulong)*(undefined8 *)(*local_1bc8 + 0x10) >> 0x20);
      fStack_6e8 = (float)*(undefined8 *)(*local_1bc8 + 0x18);
      uStack_6e4 = (undefined4)((ulong)*(undefined8 *)(*local_1bc8 + 0x18) >> 0x20);
      local_23a0 = CONCAT44(fStack_6fc * fStack_69c,local_700 * local_6a0);
      uStack_2398 = CONCAT44(fStack_6f4 * fStack_694,fStack_6f8 * fStack_698);
      uStack_2390 = CONCAT44(fStack_6ec * fStack_68c,fStack_6f0 * fStack_690);
      uStack_2388 = CONCAT44(uStack_6e4,fStack_6e8 * fStack_688);
      *(undefined8 *)*local_1bc8 = local_23a0;
      *(undefined8 *)(*local_1bc8 + 8) = uStack_2398;
      *(undefined8 *)(*local_1bc8 + 0x10) = uStack_2390;
      *(undefined8 *)(*local_1bc8 + 0x18) = uStack_2388;
      local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x20);
    }
    for (; local_2324 + 3 < iVar18; local_2324 = local_2324 + 4) {
      local_450 = (float)*(undefined8 *)*local_1bc8;
      fStack_44c = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
      fStack_448 = (float)*(undefined8 *)(*local_1bc8 + 8);
      fStack_444 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
      local_23b0 = CONCAT44(fStack_44c * fStack_45c,local_450 * local_460);
      uStack_23a8 = CONCAT44(fStack_444 * fStack_454,fStack_448 * fStack_458);
      *(undefined8 *)*local_1bc8 = local_23b0;
      *(undefined8 *)(*local_1bc8 + 8) = uStack_23a8;
      local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x10);
    }
    for (; local_2324 < iVar18; local_2324 = local_2324 + 1) {
      *(float *)*local_1bc8 = *(float *)*local_1bc8 * local_1c74;
      local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 4);
    }
  }
  else {
    local_1f04 = 0;
    local_1bd0 = in_RSI;
    if (in_ECX == 0x10) {
      for (; local_1f04 + 0xf < iVar18; local_1f04 = local_1f04 + 0x10) {
        auVar20 = vbroadcastss_avx512f(ZEXT416(*(uint *)*local_1bd0));
        auVar21 = vmulps_avx512f(*local_1bc8,local_1c40);
        auVar20 = vmulps_avx512f(auVar21,auVar20);
        local_1f80 = auVar20._0_8_;
        uStack_1f78 = auVar20._8_8_;
        uStack_1f70 = auVar20._16_8_;
        uStack_1f68 = auVar20._24_8_;
        uStack_1f60 = auVar20._32_8_;
        uStack_1f58 = auVar20._40_8_;
        uStack_1f50 = auVar20._48_8_;
        uStack_1f48 = auVar20._56_8_;
        *(undefined8 *)*local_1bc8 = local_1f80;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_1f78;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_1f70;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_1f68;
        *(undefined8 *)(*local_1bc8 + 0x20) = uStack_1f60;
        *(undefined8 *)(*local_1bc8 + 0x28) = uStack_1f58;
        *(undefined8 *)(*local_1bc8 + 0x30) = uStack_1f50;
        *(undefined8 *)(*local_1bc8 + 0x38) = uStack_1f48;
        local_1bc8 = local_1bc8 + 1;
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 4);
      }
    }
    if (in_ECX == 8) {
      for (; local_1f04 + 0xf < iVar18; local_1f04 = local_1f04 + 0x10) {
        uVar1 = *(uint *)*local_1bd0;
        auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        uStack_290 = auVar6._0_8_;
        uStack_288 = auVar6._8_8_;
        uVar1 = *(uint *)(*local_1bd0 + 4);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
        uStack_250 = auVar7._0_8_;
        uStack_248 = auVar7._8_8_;
        auVar10._16_8_ = uStack_250;
        auVar10._0_16_ = auVar6;
        auVar10._24_8_ = uStack_248;
        auVar20 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(uStack_288,CONCAT816(uStack_290,auVar5))),auVar10,1)
        ;
        auVar21 = vmulps_avx512f(*local_1bc8,local_1c40);
        auVar20 = vmulps_avx512f(auVar21,auVar20);
        local_2000 = auVar20._0_8_;
        uStack_1ff8 = auVar20._8_8_;
        uStack_1ff0 = auVar20._16_8_;
        uStack_1fe8 = auVar20._24_8_;
        uStack_1fe0 = auVar20._32_8_;
        uStack_1fd8 = auVar20._40_8_;
        uStack_1fd0 = auVar20._48_8_;
        uStack_1fc8 = auVar20._56_8_;
        *(undefined8 *)*local_1bc8 = local_2000;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_1ff8;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_1ff0;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_1fe8;
        *(undefined8 *)(*local_1bc8 + 0x20) = uStack_1fe0;
        *(undefined8 *)(*local_1bc8 + 0x28) = uStack_1fd8;
        *(undefined8 *)(*local_1bc8 + 0x30) = uStack_1fd0;
        *(undefined8 *)(*local_1bc8 + 0x38) = uStack_1fc8;
        local_1bc8 = local_1bc8 + 1;
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 8);
      }
      for (; local_1f04 + 7 < iVar18; local_1f04 = local_1f04 + 8) {
        uVar1 = *(uint *)*local_1bd0;
        auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        local_580 = (float)*(undefined8 *)*local_1bc8;
        fStack_57c = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
        fStack_578 = (float)*(undefined8 *)(*local_1bc8 + 8);
        fStack_574 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
        fStack_570 = (float)*(undefined8 *)(*local_1bc8 + 0x10);
        fStack_56c = (float)((ulong)*(undefined8 *)(*local_1bc8 + 0x10) >> 0x20);
        fStack_568 = (float)*(undefined8 *)(*local_1bc8 + 0x18);
        uStack_564 = (undefined4)((ulong)*(undefined8 *)(*local_1bc8 + 0x18) >> 0x20);
        local_5e0 = auVar6._0_4_;
        fStack_5dc = auVar6._4_4_;
        fStack_5d8 = auVar6._8_4_;
        fStack_5d4 = auVar6._12_4_;
        fStack_5d0 = auVar5._0_4_;
        fStack_5cc = auVar5._4_4_;
        fStack_5c8 = auVar5._8_4_;
        local_20a0 = CONCAT44(fStack_57c * fStack_69c * fStack_5dc,local_580 * local_6a0 * local_5e0
                             );
        uStack_2098 = CONCAT44(fStack_574 * fStack_694 * fStack_5d4,
                               fStack_578 * fStack_698 * fStack_5d8);
        uStack_2090 = CONCAT44(fStack_56c * fStack_68c * fStack_5cc,
                               fStack_570 * fStack_690 * fStack_5d0);
        uStack_2088 = CONCAT44(uStack_564,fStack_568 * fStack_688 * fStack_5c8);
        *(undefined8 *)*local_1bc8 = local_20a0;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_2098;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_2090;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_2088;
        local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x20);
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 4);
      }
    }
    if (in_ECX == 4) {
      for (; local_1f04 + 0xf < iVar18; local_1f04 = local_1f04 + 0x10) {
        uVar2 = *(undefined4 *)*local_1bd0;
        uVar3 = *(undefined4 *)(*local_1bd0 + 4);
        uVar4 = *(undefined4 *)(*local_1bd0 + 8);
        auVar9._4_4_ = uVar4;
        auVar9._0_4_ = uVar4;
        auVar9._12_4_ = uVar4;
        auVar9._8_4_ = uVar4;
        uVar4 = *(undefined4 *)(*local_1bd0 + 0xc);
        auVar9._20_4_ = uVar4;
        auVar9._16_4_ = uVar4;
        auVar9._28_4_ = uVar4;
        auVar9._24_4_ = uVar4;
        auVar20 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(CONCAT44(uVar3,uVar3),
                                                CONCAT816(CONCAT44(uVar3,uVar3),
                                                          CONCAT88(CONCAT44(uVar2,uVar2),
                                                                   CONCAT44(uVar2,uVar2))))),auVar9,
                             1);
        auVar21 = vmulps_avx512f(*local_1bc8,local_1c40);
        auVar20 = vmulps_avx512f(auVar21,auVar20);
        local_2100 = auVar20._0_8_;
        uStack_20f8 = auVar20._8_8_;
        uStack_20f0 = auVar20._16_8_;
        uStack_20e8 = auVar20._24_8_;
        uStack_20e0 = auVar20._32_8_;
        uStack_20d8 = auVar20._40_8_;
        uStack_20d0 = auVar20._48_8_;
        uStack_20c8 = auVar20._56_8_;
        *(undefined8 *)*local_1bc8 = local_2100;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_20f8;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_20f0;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_20e8;
        *(undefined8 *)(*local_1bc8 + 0x20) = uStack_20e0;
        *(undefined8 *)(*local_1bc8 + 0x28) = uStack_20d8;
        *(undefined8 *)(*local_1bc8 + 0x30) = uStack_20d0;
        *(undefined8 *)(*local_1bc8 + 0x38) = uStack_20c8;
        local_1bc8 = local_1bc8 + 1;
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 0x10);
      }
      for (; local_1f04 + 7 < iVar18; local_1f04 = local_1f04 + 8) {
        fVar22 = *(float *)*local_1bd0;
        fVar24 = *(float *)(*local_1bd0 + 4);
        local_600 = (float)*(undefined8 *)*local_1bc8;
        fStack_5fc = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
        fStack_5f8 = (float)*(undefined8 *)(*local_1bc8 + 8);
        fStack_5f4 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
        fStack_5f0 = (float)*(undefined8 *)(*local_1bc8 + 0x10);
        fStack_5ec = (float)((ulong)*(undefined8 *)(*local_1bc8 + 0x10) >> 0x20);
        fStack_5e8 = (float)*(undefined8 *)(*local_1bc8 + 0x18);
        uStack_5e4 = (undefined4)((ulong)*(undefined8 *)(*local_1bc8 + 0x18) >> 0x20);
        local_21e0 = CONCAT44(fStack_5fc * fStack_69c * fVar22,local_600 * local_6a0 * fVar22);
        uStack_21d8 = CONCAT44(fStack_5f4 * fStack_694 * fVar22,fStack_5f8 * fStack_698 * fVar22);
        uStack_21d0 = CONCAT44(fStack_5ec * fStack_68c * fVar24,fStack_5f0 * fStack_690 * fVar24);
        uStack_21c8 = CONCAT44(uStack_5e4,fStack_5e8 * fStack_688 * fVar24);
        *(undefined8 *)*local_1bc8 = local_21e0;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_21d8;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_21d0;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_21c8;
        local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x20);
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 8);
      }
      for (; local_1f04 + 3 < iVar18; local_1f04 = local_1f04 + 4) {
        fVar22 = *(float *)*local_1bd0;
        local_3d0 = (float)*(undefined8 *)*local_1bc8;
        fStack_3cc = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
        fStack_3c8 = (float)*(undefined8 *)(*local_1bc8 + 8);
        fStack_3c4 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
        local_2230 = CONCAT44(fStack_3cc * fStack_45c * fVar22,local_3d0 * local_460 * fVar22);
        uStack_2228 = CONCAT44(fStack_3c4 * fStack_454 * fVar22,fStack_3c8 * fStack_458 * fVar22);
        *(undefined8 *)*local_1bc8 = local_2230;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_2228;
        local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x10);
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 4);
      }
    }
    if (in_ECX == 1) {
      for (; local_1f04 + 0xf < iVar18; local_1f04 = local_1f04 + 0x10) {
        auVar20 = vmulps_avx512f(*local_1bc8,local_1c40);
        auVar20 = vmulps_avx512f(auVar20,*local_1bd0);
        local_2280 = auVar20._0_8_;
        uStack_2278 = auVar20._8_8_;
        uStack_2270 = auVar20._16_8_;
        uStack_2268 = auVar20._24_8_;
        uStack_2260 = auVar20._32_8_;
        uStack_2258 = auVar20._40_8_;
        uStack_2250 = auVar20._48_8_;
        uStack_2248 = auVar20._56_8_;
        *(undefined8 *)*local_1bc8 = local_2280;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_2278;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_2270;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_2268;
        *(undefined8 *)(*local_1bc8 + 0x20) = uStack_2260;
        *(undefined8 *)(*local_1bc8 + 0x28) = uStack_2258;
        *(undefined8 *)(*local_1bc8 + 0x30) = uStack_2250;
        *(undefined8 *)(*local_1bc8 + 0x38) = uStack_2248;
        local_1bc8 = local_1bc8 + 1;
        local_1bd0 = local_1bd0 + 1;
      }
      for (; local_1f04 + 7 < iVar18; local_1f04 = local_1f04 + 8) {
        local_680 = (float)*(undefined8 *)*local_1bc8;
        fStack_67c = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
        fStack_678 = (float)*(undefined8 *)(*local_1bc8 + 8);
        fStack_674 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
        fStack_670 = (float)*(undefined8 *)(*local_1bc8 + 0x10);
        fStack_66c = (float)((ulong)*(undefined8 *)(*local_1bc8 + 0x10) >> 0x20);
        fStack_668 = (float)*(undefined8 *)(*local_1bc8 + 0x18);
        uStack_664 = (undefined4)((ulong)*(undefined8 *)(*local_1bc8 + 0x18) >> 0x20);
        local_6e0 = (float)*(undefined8 *)*local_1bd0;
        fStack_6dc = (float)((ulong)*(undefined8 *)*local_1bd0 >> 0x20);
        fStack_6d8 = (float)*(undefined8 *)(*local_1bd0 + 8);
        fStack_6d4 = (float)((ulong)*(undefined8 *)(*local_1bd0 + 8) >> 0x20);
        fStack_6d0 = (float)*(undefined8 *)(*local_1bd0 + 0x10);
        fStack_6cc = (float)((ulong)*(undefined8 *)(*local_1bd0 + 0x10) >> 0x20);
        fStack_6c8 = (float)*(undefined8 *)(*local_1bd0 + 0x18);
        local_22e0 = CONCAT44(fStack_67c * fStack_69c * fStack_6dc,local_680 * local_6a0 * local_6e0
                             );
        uStack_22d8 = CONCAT44(fStack_674 * fStack_694 * fStack_6d4,
                               fStack_678 * fStack_698 * fStack_6d8);
        uStack_22d0 = CONCAT44(fStack_66c * fStack_68c * fStack_6cc,
                               fStack_670 * fStack_690 * fStack_6d0);
        uStack_22c8 = CONCAT44(uStack_664,fStack_668 * fStack_688 * fStack_6c8);
        *(undefined8 *)*local_1bc8 = local_22e0;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_22d8;
        *(undefined8 *)(*local_1bc8 + 0x10) = uStack_22d0;
        *(undefined8 *)(*local_1bc8 + 0x18) = uStack_22c8;
        local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x20);
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 0x20);
      }
      for (; local_1f04 + 3 < iVar18; local_1f04 = local_1f04 + 4) {
        local_410 = (float)*(undefined8 *)*local_1bc8;
        fStack_40c = (float)((ulong)*(undefined8 *)*local_1bc8 >> 0x20);
        fStack_408 = (float)*(undefined8 *)(*local_1bc8 + 8);
        fStack_404 = (float)((ulong)*(undefined8 *)(*local_1bc8 + 8) >> 0x20);
        local_440 = (float)*(undefined8 *)*local_1bd0;
        fStack_43c = (float)((ulong)*(undefined8 *)*local_1bd0 >> 0x20);
        fStack_438 = (float)*(undefined8 *)(*local_1bd0 + 8);
        fStack_434 = (float)((ulong)*(undefined8 *)(*local_1bd0 + 8) >> 0x20);
        local_2310 = CONCAT44(fStack_40c * fStack_45c * fStack_43c,local_410 * local_460 * local_440
                             );
        uStack_2308 = CONCAT44(fStack_404 * fStack_454 * fStack_434,
                               fStack_408 * fStack_458 * fStack_438);
        *(undefined8 *)*local_1bc8 = local_2310;
        *(undefined8 *)(*local_1bc8 + 8) = uStack_2308;
        local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 0x10);
        local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 0x10);
      }
    }
    for (; local_1f04 < iVar18; local_1f04 = local_1f04 + 1) {
      *(float *)*local_1bc8 = *(float *)*local_1bc8 * local_1c74 * *(float *)*local_1bd0;
      local_1bc8 = (undefined1 (*) [64])(*local_1bc8 + 4);
      local_1bd0 = (undefined1 (*) [64])(*local_1bd0 + 4);
    }
  }
  return;
}

Assistant:

static void rmsnorm(float* ptr, const float* gamma_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _rms_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _rms_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _rms = _mm_set1_ps(0.f);
#endif // __SSE2__
    float rms = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _rms_avx512 = _mm512_fmadd_ps(_p, _p, _rms_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _rms_avx = _mm256_comp_fmadd_ps(_p, _p, _rms_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _rms = _mm_comp_fmadd_ps(_p, _p, _rms);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            rms += ptr0[0] * ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);

        _rms_avx512 = _mm512_div_ps(_rms_avx512, _elemcount);
        _rms_avx512 = _mm512_add_ps(_rms_avx512, _eps);

        __m256 _rms0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 0));
        __m256 _rms1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 1));
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms0), _rms1, 1);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);

        _rms_avx = _mm256_div_ps(_rms_avx, _elemcount);
        _rms_avx = _mm256_add_ps(_rms_avx, _eps);

        _rms_avx = _mm256_rsqrt_ps(_rms_avx);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__
        {
            __m128 _rms0 = _mm256_castps256_ps128(_rms_avx);
            __m128 _rms1 = _mm256_extractf128_ps(_rms_avx, 1);
            _rms = _mm_add_ps(_rms, _rms0);
            _rms = _mm_add_ps(_rms, _rms1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);

        _rms = _mm_div_ps(_rms, _elemcount);
        _rms = _mm_add_ps(_rms, _eps);

        _rms = _mm_rsqrt_ps(_rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        rms += _mm512_comp_reduce_add_ps(_rms_avx512);
#endif // __AVX512F__
        rms += _mm256_reduce_add_ps(_rms_avx);
#endif // __AVX__
        rms += _mm_reduce_add_ps(_rms);
#endif // __SSE2__

        rms = 1.f / sqrtf(rms / elemcount + eps);
#if __SSE2__
        _rms = _mm_set1_ps(rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * rms) * gamma_ptr[0];
            ptr++;
            gamma_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _rms_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _rms_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _rms);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * rms;
            ptr++;
        }
    }
}